

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O2

void __thiscall QUnixPrintWidgetPrivate::setupPrinterProperties(QUnixPrintWidgetPrivate *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QPrintPropertiesDialog *this_00;
  QPrinter *printer;
  OutputFormat outputFormat;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->propertiesDialog != (QPrintPropertiesDialog *)0x0) {
    (**(code **)(*(long *)this->propertiesDialog + 0x20))();
  }
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  outputFormat = PdfFormat;
  bVar1 = QPrintDialog::testOption((QPrintDialog *)this->q,PrintToFile);
  if (bVar1) {
    iVar2 = QComboBox::currentIndex();
    iVar3 = QComboBox::count();
    if (iVar2 == iVar3 + -1) goto LAB_00142dae;
  }
  QComboBox::currentText();
  local_48.ptr = local_68.ptr;
  local_48.d = local_68.d;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_48.size = local_68.size;
  local_68.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  outputFormat = NativeFormat;
LAB_00142dae:
  this_00 = (QPrintPropertiesDialog *)operator_new(0x88);
  printer = QAbstractPrintDialog::printer((QAbstractPrintDialog *)this->q);
  QPrintPropertiesDialog::QPrintPropertiesDialog
            ((QPrintPropertiesDialog *)this_00,printer,&this->m_currentPrintDevice,outputFormat,
             (QString *)&local_48,&this->q->super_QAbstractPrintDialog);
  this->propertiesDialog = this_00;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnixPrintWidgetPrivate::setupPrinterProperties()
{
    delete propertiesDialog;

    QPrinter::OutputFormat outputFormat;
    QString printerName;

    if (q->testOption(QPrintDialog::PrintToFile)
        && (widget.printers->currentIndex() == widget.printers->count() - 1)) {// PDF
        outputFormat = QPrinter::PdfFormat;
    } else {
        outputFormat = QPrinter::NativeFormat;
        printerName = widget.printers->currentText();
    }

    propertiesDialog = new QPrintPropertiesDialog(q->printer(), &m_currentPrintDevice, outputFormat, printerName, q);
}